

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

_Bool ssh2_scan_kexinits(ptrlen client_kexinit,ptrlen server_kexinit,
                        kexinit_algorithm_list *kexlists,ssh_kex **kex_alg,ssh_keyalg **hostkey_alg,
                        transport_direction *cs,transport_direction *sc,_Bool *warn_kex,
                        _Bool *warn_hk,_Bool *warn_cscipher,_Bool *warn_sccipher,Ssh *ssh,
                        _Bool *ignore_guess_cs_packet,_Bool *ignore_guess_sc_packet,
                        server_hostkeys *server_hostkeys,uint *hkflags,_Bool *can_send_ext_info)

{
  char *pcVar1;
  kexinit_algorithm *pkVar2;
  size_t sVar3;
  ptrlen pl1;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  uint uVar7;
  int *piVar8;
  ptrlen pVar9;
  byte local_33a;
  byte local_339;
  undefined1 local_318 [8];
  ptrlen word_1;
  ptrlen list_1;
  ptrlen word;
  ptrlen list;
  ptrlen extinfo_advert;
  kexinit_algorithm *alg;
  void *local_280;
  void *local_278;
  void *local_270;
  void *local_268;
  int local_260;
  int j;
  _Bool sfirst;
  _Bool cfirst;
  ptrlen found;
  ptrlen sword;
  ptrlen cword;
  ptrlen slist;
  ptrlen clist;
  kexinit_algorithm *pkStack_1e8;
  kexinit_algorithm *selected [8];
  ptrlen slists [8];
  ptrlen clists [8];
  byte local_9d;
  uint local_9c;
  undefined1 local_98 [3];
  _Bool guess_correct;
  int i;
  BinarySource server [1];
  undefined1 local_68 [8];
  BinarySource client [1];
  ssh_kex **kex_alg_local;
  kexinit_algorithm_list *kexlists_local;
  ptrlen server_kexinit_local;
  ptrlen client_kexinit_local;
  
  client[0].binarysource_ = (BinarySource *)kex_alg;
  BinarySource_INIT__((BinarySource *)local_68,client_kexinit);
  BinarySource_INIT__((BinarySource *)local_98,server_kexinit);
  BinarySource_get_data((BinarySource *)client[0]._24_8_,0x11);
  BinarySource_get_data((BinarySource *)server[0]._24_8_,0x11);
  local_9d = 1;
  local_9c = 0;
LAB_00144c65:
  if ((int)local_9c < 8) {
    pVar9 = BinarySource_get_string((BinarySource *)client[0]._24_8_);
    local_270 = pVar9.ptr;
    slists[(long)(int)local_9c + 7].len = (size_t)local_270;
    local_268 = (void *)pVar9.len;
    clists[(int)local_9c].ptr = local_268;
    pVar9 = BinarySource_get_string((BinarySource *)server[0]._24_8_);
    local_280 = pVar9.ptr;
    slists[(long)(int)local_9c + -1].len = (size_t)local_280;
    local_278 = (void *)pVar9.len;
    slists[(int)local_9c].ptr = local_278;
    if ((*(int *)(client[0]._24_8_ + 0x18) != 0) || (*(int *)(server[0]._24_8_ + 0x18) != 0)) {
      ssh_proto_error(ssh,"KEXINIT packet was incomplete");
      return false;
    }
    bVar4 = true;
    slist.len = slists[(long)(int)local_9c + 7].len;
    while (_Var6 = get_commasep_word((ptrlen *)&slist.len,(ptrlen *)&sword.len), _Var6) {
      bVar5 = true;
      cword.len = slists[(long)(int)local_9c + -1].len;
      slist.ptr = slists[(int)local_9c].ptr;
      while (_Var6 = get_commasep_word((ptrlen *)&cword.len,(ptrlen *)&found.len), _Var6) {
        pVar9.len = (size_t)cword.ptr;
        pVar9.ptr = (void *)sword.len;
        _Var6 = ptrlen_eq_ptrlen(pVar9,stack0xfffffffffffffdb8);
        sVar3 = sword.len;
        if (_Var6) {
          found.ptr = cword.ptr;
          selected[(long)(int)local_9c + -1] = (kexinit_algorithm *)0x0;
          local_260 = 0;
          goto LAB_00144e76;
        }
        bVar5 = false;
      }
      bVar4 = false;
    }
    selected[(long)(int)local_9c + -1] = (kexinit_algorithm *)0x0;
    local_9d = 0;
    goto LAB_00144fc3;
  }
  BinarySource_get_string((BinarySource *)client[0]._24_8_);
  BinarySource_get_string((BinarySource *)client[0]._24_8_);
  BinarySource_get_string((BinarySource *)server[0]._24_8_);
  BinarySource_get_string((BinarySource *)server[0]._24_8_);
  if (ignore_guess_cs_packet != (_Bool *)0x0) {
    _Var6 = BinarySource_get_bool((BinarySource *)client[0]._24_8_);
    local_339 = 0;
    if (_Var6) {
      local_339 = local_9d ^ 0xff;
    }
    *ignore_guess_cs_packet = (_Bool)(local_339 & 1);
  }
  if (ignore_guess_sc_packet != (_Bool *)0x0) {
    _Var6 = BinarySource_get_bool((BinarySource *)server[0]._24_8_);
    local_33a = 0;
    if (_Var6) {
      local_33a = local_9d ^ 0xff;
    }
    *ignore_guess_sc_packet = (_Bool)(local_33a & 1);
  }
  for (local_9c = 0; (int)local_9c < 8; local_9c = local_9c + 1) {
    if (((local_9c == 4) && (cs->cipher != (ssh_cipheralg *)0x0)) &&
       (cs->cipher->required_mac != (ssh2_macalg *)0x0)) {
      cs->mac = cs->cipher->required_mac;
      cs->etm_mode = cs->mac->etm_name != (char *)0x0;
    }
    else if (((local_9c == 5) && (sc->cipher != (ssh_cipheralg *)0x0)) &&
            (sc->cipher->required_mac != (ssh2_macalg *)0x0)) {
      sc->mac = sc->cipher->required_mac;
      sc->etm_mode = sc->mac->etm_name != (char *)0x0;
    }
    else {
      pkVar2 = selected[(long)(int)local_9c + -1];
      if (pkVar2 == (kexinit_algorithm *)0x0) {
        pcVar1 = kexlist_descr[(int)local_9c];
        uVar7 = string_length_for_printf((size_t)slists[(int)local_9c].ptr);
        ssh_sw_abort(ssh,"Couldn\'t agree a %s (available: %.*s)",pcVar1,(ulong)uVar7,
                     slists[(long)(int)local_9c + -1].len);
        return false;
      }
      switch(local_9c) {
      case 0:
        (client[0].binarysource_)->data = (pkVar2->u).kex.kex;
        *warn_kex = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      case 1:
        if (((pkVar2->u).kex.kex != (ssh_kex *)0x0) ||
           (*(int *)((long)(client[0].binarysource_)->data + 0x10) == 3)) {
          *hostkey_alg = (ssh_keyalg *)(pkVar2->u).kex.kex;
          *hkflags = (pkVar2->u).hk.hkflags;
          *warn_hk = (_Bool)((pkVar2->u).hk.warn & 1);
        }
        break;
      case 2:
        cs->cipher = (ssh_cipheralg *)(pkVar2->u).kex.kex;
        *warn_cscipher = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      case 3:
        sc->cipher = (ssh_cipheralg *)(pkVar2->u).kex.kex;
        *warn_sccipher = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      case 4:
        cs->mac = (ssh2_macalg *)(pkVar2->u).kex.kex;
        cs->etm_mode = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      case 5:
        sc->mac = (ssh2_macalg *)(pkVar2->u).kex.kex;
        sc->etm_mode = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      case 6:
        cs->comp = (ssh_compression_alg *)(pkVar2->u).kex.kex;
        cs->comp_delayed = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      case 7:
        sc->comp = (ssh_compression_alg *)(pkVar2->u).kex.kex;
        sc->comp_delayed = (_Bool)((pkVar2->u).kex.warn & 1);
        break;
      default:
        __assert_fail("false && \"Bad list index in scan_kexinits\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                      ,0x46e,
                      "_Bool ssh2_scan_kexinits(ptrlen, ptrlen, struct kexinit_algorithm_list *, const ssh_kex **, const ssh_keyalg **, transport_direction *, transport_direction *, _Bool *, _Bool *, _Bool *, _Bool *, Ssh *, _Bool *, _Bool *, struct server_hostkeys *, unsigned int *, _Bool *)"
                     );
      }
    }
  }
  if (server_hostkeys == (server_hostkeys *)0x0) {
    pVar9 = make_ptrlen("ext-info-s",10);
    word.len = (size_t)selected[7];
  }
  else {
    pVar9 = make_ptrlen("ext-info-c",10);
    word.len = slists[7].len;
  }
  while (_Var6 = get_commasep_word((ptrlen *)&word.len,(ptrlen *)&list_1.len), _Var6) {
    _Var6 = ptrlen_eq_ptrlen(stack0xfffffffffffffd08,pVar9);
    if (_Var6) {
      *can_send_ext_info = true;
    }
  }
  if (server_hostkeys != (server_hostkeys *)0x0) {
    word_1.len = slists[0].len;
    list_1.ptr = slists[1].ptr;
LAB_0014554d:
    _Var6 = get_commasep_word((ptrlen *)&word_1.len,(ptrlen *)local_318);
    if (_Var6) {
      for (local_9c = 0; local_9c < 0x11; local_9c = local_9c + 1) {
        _Var6 = ptrlen_eq_string(_local_318,(ssh2_hostkey_algs[(int)local_9c].alg)->ssh_id);
        if (_Var6) {
          piVar8 = (int *)safegrowarray(server_hostkeys->indices,&server_hostkeys->size,4,
                                        server_hostkeys->n,1,false);
          server_hostkeys->indices = piVar8;
          sVar3 = server_hostkeys->n;
          server_hostkeys->n = sVar3 + 1;
          server_hostkeys->indices[sVar3] = local_9c;
          break;
        }
      }
      goto LAB_0014554d;
    }
  }
  return true;
LAB_00144e76:
  if (kexlists[(int)local_9c].nalgs <= (ulong)(long)local_260) goto LAB_00144f26;
  pl1.len = (size_t)found.ptr;
  pl1.ptr = (void *)sVar3;
  _Var6 = ptrlen_eq_ptrlen(pl1,kexlists[(int)local_9c].algs[local_260].name);
  if (_Var6) {
    selected[(long)(int)local_9c + -1] = kexlists[(int)local_9c].algs + local_260;
    goto LAB_00144f26;
  }
  local_260 = local_260 + 1;
  goto LAB_00144e76;
LAB_00144f26:
  if (selected[(long)(int)local_9c + -1] == (kexinit_algorithm *)0x0) {
    pcVar1 = kexlist_descr[(int)local_9c];
    uVar7 = string_length_for_printf((size_t)found.ptr);
    ssh_sw_abort(ssh,"Selected %s \"%.*s\" does not correspond to any supported algorithm",pcVar1,
                 (ulong)uVar7,sVar3);
    return false;
  }
  if ((((local_9c == 0) || (local_9c == 1)) && (!bVar4)) && (!bVar5)) {
    local_9d = 0;
  }
LAB_00144fc3:
  local_9c = local_9c + 1;
  goto LAB_00144c65;
}

Assistant:

static bool ssh2_scan_kexinits(
    ptrlen client_kexinit, ptrlen server_kexinit,
    struct kexinit_algorithm_list kexlists[NKEXLIST],
    const ssh_kex **kex_alg, const ssh_keyalg **hostkey_alg,
    transport_direction *cs, transport_direction *sc,
    bool *warn_kex, bool *warn_hk, bool *warn_cscipher, bool *warn_sccipher,
    Ssh *ssh, bool *ignore_guess_cs_packet, bool *ignore_guess_sc_packet,
    struct server_hostkeys *server_hostkeys, unsigned *hkflags,
    bool *can_send_ext_info)
{
    BinarySource client[1], server[1];
    int i;
    bool guess_correct;
    ptrlen clists[NKEXLIST], slists[NKEXLIST];
    const struct kexinit_algorithm *selected[NKEXLIST];

    BinarySource_BARE_INIT_PL(client, client_kexinit);
    BinarySource_BARE_INIT_PL(server, server_kexinit);

    /* Skip packet type bytes and random cookies. */
    get_data(client, 1 + 16);
    get_data(server, 1 + 16);

    guess_correct = true;

    /* Find the matching string in each list, and map it to its
     * kexinit_algorithm structure. */
    for (i = 0; i < NKEXLIST; i++) {
        ptrlen clist, slist, cword, sword, found;
        bool cfirst, sfirst;
        int j;

        clists[i] = get_string(client);
        slists[i] = get_string(server);
        if (get_err(client) || get_err(server)) {
            /* Report a better error than the spurious "Couldn't
             * agree" that we'd generate if we pressed on regardless
             * and treated the empty get_string() result as genuine */
            ssh_proto_error(ssh, "KEXINIT packet was incomplete");
            return false;
        }

        for (cfirst = true, clist = clists[i];
             get_commasep_word(&clist, &cword); cfirst = false)
            for (sfirst = true, slist = slists[i];
                 get_commasep_word(&slist, &sword); sfirst = false)
                if (ptrlen_eq_ptrlen(cword, sword)) {
                    found = cword;
                    goto found_match;
                }

        /* No matching string found in the two lists. Delay reporting
         * a fatal error until below, because sometimes it turns out
         * not to be fatal. */
        selected[i] = NULL;

        /*
         * However, even if a failure to agree on any algorithm at all
         * is not completely fatal (e.g. because it's the MAC
         * negotiation for a cipher that comes with a built-in MAC),
         * it still invalidates the guessed key exchange packet. (RFC
         * 4253 section 7, not contradicted by OpenSSH's
         * PROTOCOL.chacha20poly1305 or as far as I can see by their
         * code.)
         */
        guess_correct = false;

        continue;

      found_match:

        selected[i] = NULL;
        for (j = 0; j < kexlists[i].nalgs; j++) {
            if (ptrlen_eq_ptrlen(found, kexlists[i].algs[j].name)) {
                selected[i] = &kexlists[i].algs[j];
                break;
            }
        }
        if (!selected[i]) {
            /*
             * In the client, this should never happen! But in the
             * server, where we allow manual override on the command
             * line of the exact KEXINIT strings, it can happen
             * because the command line contained a typo. So we
             * produce a reasonably useful message instead of an
             * assertion failure.
             */
            ssh_sw_abort(ssh, "Selected %s \"%.*s\" does not correspond to "
                         "any supported algorithm",
                         kexlist_descr[i], PTRLEN_PRINTF(found));
            return false;
        }

        /*
         * If the kex or host key algorithm is not the first one in
         * both sides' lists, that means the guessed key exchange
         * packet (if any) is officially wrong.
         */
        if ((i == KEXLIST_KEX || i == KEXLIST_HOSTKEY) && !(cfirst || sfirst))
            guess_correct = false;
    }

    /*
     * Skip language strings in both KEXINITs, and read the flags
     * saying whether a guessed KEX packet follows.
     */
    get_string(client);
    get_string(client);
    get_string(server);
    get_string(server);
    if (ignore_guess_cs_packet)
        *ignore_guess_cs_packet = get_bool(client) && !guess_correct;
    if (ignore_guess_sc_packet)
        *ignore_guess_sc_packet = get_bool(server) && !guess_correct;

    /*
     * Now transcribe the selected algorithm set into the output data.
     */
    for (i = 0; i < NKEXLIST; i++) {
        const struct kexinit_algorithm *alg;

        /*
         * If we've already selected a cipher which requires a
         * particular MAC, then just select that. This is the case in
         * which it's not a fatal error if the actual MAC string lists
         * didn't include any matching error.
         */
        if (i == KEXLIST_CSMAC && cs->cipher &&
            cs->cipher->required_mac) {
            cs->mac = cs->cipher->required_mac;
            cs->etm_mode = !!(cs->mac->etm_name);
            continue;
        }
        if (i == KEXLIST_SCMAC && sc->cipher &&
            sc->cipher->required_mac) {
            sc->mac = sc->cipher->required_mac;
            sc->etm_mode = !!(sc->mac->etm_name);
            continue;
        }

        alg = selected[i];
        if (!alg) {
            /*
             * Otherwise, any match failure _is_ a fatal error.
             */
            ssh_sw_abort(ssh, "Couldn't agree a %s (available: %.*s)",
                         kexlist_descr[i], PTRLEN_PRINTF(slists[i]));
            return false;
        }

        switch (i) {
          case KEXLIST_KEX:
            *kex_alg = alg->u.kex.kex;
            *warn_kex = alg->u.kex.warn;
            break;

          case KEXLIST_HOSTKEY:
            /*
             * Ignore an unexpected/inappropriate offer of "null",
             * we offer "null" when we're willing to use GSS KEX,
             * but it is only acceptable when GSSKEX is actually
             * selected.
             */
            if (alg->u.hk.hostkey == NULL &&
                (*kex_alg)->main_type != KEXTYPE_GSS)
                continue;

            *hostkey_alg = alg->u.hk.hostkey;
            *hkflags = alg->u.hk.hkflags;
            *warn_hk = alg->u.hk.warn;
            break;

          case KEXLIST_CSCIPHER:
            cs->cipher = alg->u.cipher.cipher;
            *warn_cscipher = alg->u.cipher.warn;
            break;

          case KEXLIST_SCCIPHER:
            sc->cipher = alg->u.cipher.cipher;
            *warn_sccipher = alg->u.cipher.warn;
            break;

          case KEXLIST_CSMAC:
            cs->mac = alg->u.mac.mac;
            cs->etm_mode = alg->u.mac.etm;
            break;

          case KEXLIST_SCMAC:
            sc->mac = alg->u.mac.mac;
            sc->etm_mode = alg->u.mac.etm;
            break;

          case KEXLIST_CSCOMP:
            cs->comp = alg->u.comp.comp;
            cs->comp_delayed = alg->u.comp.delayed;
            break;

          case KEXLIST_SCCOMP:
            sc->comp = alg->u.comp.comp;
            sc->comp_delayed = alg->u.comp.delayed;
            break;

          default:
            unreachable("Bad list index in scan_kexinits");
        }
    }

    /*
     * Check whether the other side advertised support for EXT_INFO.
     */
    {
        ptrlen extinfo_advert =
            (server_hostkeys ? PTRLEN_LITERAL("ext-info-c") :
             PTRLEN_LITERAL("ext-info-s"));
        ptrlen list = (server_hostkeys ? clists[KEXLIST_KEX] :
                       slists[KEXLIST_KEX]);
        for (ptrlen word; get_commasep_word(&list, &word) ;)
            if (ptrlen_eq_ptrlen(word, extinfo_advert))
                *can_send_ext_info = true;
    }

    if (server_hostkeys) {
        /*
         * Finally, make an auxiliary pass over the server's host key
         * list to find all the host key algorithms offered by the
         * server which we know about at all, whether we selected each
         * one or not. We return these as a list of indices into the
         * constant ssh2_hostkey_algs[] array.
         */
        ptrlen list = slists[KEXLIST_HOSTKEY];
        for (ptrlen word; get_commasep_word(&list, &word) ;) {
            for (i = 0; i < lenof(ssh2_hostkey_algs); i++)
                if (ptrlen_eq_string(word, ssh2_hostkey_algs[i].alg->ssh_id)) {
                    sgrowarray(server_hostkeys->indices, server_hostkeys->size,
                               server_hostkeys->n);
                    server_hostkeys->indices[server_hostkeys->n++] = i;
                    break;
                }
        }
    }

    return true;
}